

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_buf.c
# Opt level: O0

void * uo_buf_memcpy_append(uo_buf *buf,void *src,size_t size)

{
  ptrdiff_t pVar1;
  uo_buf puVar2;
  uchar *__dest;
  void *dst;
  size_t size_local;
  void *src_local;
  uo_buf *buf_local;
  
  while( true ) {
    pVar1 = uo_buf_get_len_after_ptr(*buf);
    if ((long)size < pVar1) break;
    puVar2 = uo_buf_realloc_2x(*buf);
    *buf = puVar2;
  }
  __dest = uo_buf_get_ptr(*buf);
  memcpy(__dest,src,size);
  uo_buf_set_ptr_rel(*buf,size);
  return __dest;
}

Assistant:

void *uo_buf_memcpy_append(
    uo_buf *restrict buf,
    const void *restrict src, 
    size_t size)
{
    while (uo_buf_get_len_after_ptr(*buf) <= (ptrdiff_t)size)
        *buf = uo_buf_realloc_2x(*buf);

    void *dst = memcpy(uo_buf_get_ptr(*buf), src, size);

    uo_buf_set_ptr_rel(*buf, size);

    return dst;
}